

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  uint *puVar1;
  float fVar2;
  ImVec2 IVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  uchar *puVar7;
  long lVar8;
  ImFont *this;
  int iVar9;
  ImFontAtlasCustomRect *pIVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint *puVar15;
  uint uVar16;
  int iVar17;
  size_t __n;
  int iVar18;
  long lVar19;
  long lVar20;
  float fVar21;
  size_t local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ulong local_48;
  ImFontAtlasCustomRect *local_40;
  ulong local_38;
  
  if ((atlas->TexPixelsAlpha8 == (uchar *)0x0) && (atlas->TexPixelsRGBA32 == (uint *)0x0)) {
    __assert_fail("atlas->TexPixelsAlpha8 != __null || atlas->TexPixelsRGBA32 != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                  ,0xade,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
  }
  pIVar10 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdMouseCursors);
  uVar4 = pIVar10->X;
  if (uVar4 == 0xffff) {
    __assert_fail("r->IsPacked()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                  ,0xa6d,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
  }
  if ((atlas->Flags & 2) == 0) {
    if ((pIVar10->Width != 0xd9) || (pIVar10->Height != 0x1b)) {
      __assert_fail("r->Width == FONT_ATLAS_DEFAULT_TEX_DATA_W * 2 + 1 && r->Height == FONT_ATLAS_DEFAULT_TEX_DATA_H"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                    ,0xa73,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,(uint)uVar4,(uint)pIVar10->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'.',0xffffffff);
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,uVar4 + 0x6d,(uint)pIVar10->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'X',0xffffffff);
    }
    else {
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,(uint)uVar4,(uint)pIVar10->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'.',0xff);
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,uVar4 + 0x6d,(uint)pIVar10->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'X',0xff);
    }
  }
  else {
    if ((pIVar10->Width != 2) || (pIVar10->Height != 2)) {
      __assert_fail("r->Width == 2 && r->Height == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                    ,0xa84,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    iVar18 = atlas->TexWidth;
    iVar9 = (uint)pIVar10->Y * iVar18 + (uint)uVar4;
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      puVar15 = atlas->TexPixelsRGBA32;
      puVar1 = puVar15 + (iVar18 + iVar9);
      puVar1[0] = 0xffffffff;
      puVar1[1] = 0xffffffff;
      puVar15 = puVar15 + iVar9;
      puVar15[0] = 0xffffffff;
      puVar15[1] = 0xffffffff;
    }
    else {
      atlas->TexPixelsAlpha8[(long)(iVar18 + iVar9) + 1] = 0xff;
      atlas->TexPixelsAlpha8[iVar18 + iVar9] = 0xff;
      atlas->TexPixelsAlpha8[(long)iVar9 + 1] = 0xff;
      atlas->TexPixelsAlpha8[iVar9] = 0xff;
    }
  }
  uVar11._0_2_ = pIVar10->X;
  uVar11._2_2_ = pIVar10->Y;
  IVar3 = atlas->TexUvScale;
  (atlas->TexUvWhitePixel).x = IVar3.x * ((float)(uVar11 & 0xffff) + 0.5);
  (atlas->TexUvWhitePixel).y = IVar3.y * ((float)(uVar11 >> 0x10) + 0.5);
  if ((atlas->Flags & 4) == 0) {
    local_40 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdLines);
    uVar4 = local_40->X;
    if (uVar4 == 0xffff) {
      __assert_fail("r->IsPacked()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                    ,0xa99,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
    }
    local_60 = 0;
    lVar20 = -0x40;
    iVar18 = 0;
    uVar13 = 0;
    do {
      if ((ulong)local_40->Height <= lVar20 + 0x40U) {
        __assert_fail("pad_left + line_width + pad_right == r->Width && y < r->Height",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                      ,0xaa3,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
      }
      uVar5 = local_40->Width;
      uVar11 = (int)uVar13 + (uint)uVar5;
      uVar14 = uVar11 >> 1;
      iVar9 = (int)lVar20;
      uVar16 = iVar9 + uVar14 + 0x40;
      iVar17 = (uVar5 - uVar14) + (int)uVar13;
      puVar7 = atlas->TexPixelsAlpha8;
      uVar12 = (uint)uVar4;
      local_38 = uVar13;
      if (puVar7 == (uchar *)0x0) {
        puVar15 = atlas->TexPixelsRGBA32;
        uVar4 = local_40->Y;
        iVar6 = atlas->TexWidth;
        puVar1 = puVar15 + ((iVar9 + (uint)uVar4 + 0x40) * iVar6 + uVar12);
        if (1 < uVar11) {
          memset(puVar1,0,(ulong)(uVar14 + (uVar14 == 0)) << 2);
        }
        if (lVar20 != -0x40) {
          memset(puVar1 + uVar14,0xff,local_60);
        }
        if (uVar16 != uVar5) {
          puVar15 = puVar15 + (ulong)(iVar6 * ((uint)uVar4 + iVar18) + uVar12) +
                              (ulong)uVar14 + lVar20 + 0x40;
          __n = (ulong)(iVar17 + (uint)(iVar17 == 0)) << 2;
          goto LAB_001cdadc;
        }
      }
      else {
        uVar4 = local_40->Y;
        local_48 = (ulong)uVar4;
        iVar6 = atlas->TexWidth;
        if (1 < uVar11) {
          memset(puVar7 + ((iVar9 + (uint)uVar4 + 0x40) * iVar6 + uVar12),0,
                 (ulong)(uVar14 + (uVar14 == 0)));
        }
        if (lVar20 != -0x40) {
          memset(puVar7 + ((iVar9 + (uint)uVar4 + 0x40) * iVar6 + uVar12) + uVar14,0xff,
                 lVar20 + 0x40U);
        }
        if (uVar16 != uVar5) {
          puVar15 = (uint *)(puVar7 + lVar20 + (ulong)(iVar6 * ((int)local_48 + iVar18) + uVar12) +
                                               (ulong)uVar14 + 0x40);
          __n = (size_t)(iVar17 + (uint)(iVar17 == 0));
LAB_001cdadc:
          memset(puVar15,0,__n);
        }
      }
      uVar4 = local_40->X;
      uVar5 = local_40->Y;
      fVar2 = (atlas->TexUvScale).x;
      fVar21 = (atlas->TexUvScale).y;
      (&atlas->TexUvLines[0].x)[local_60] = (float)((uVar14 + uVar4) - 1) * fVar2;
      fVar21 = ((float)(int)(iVar9 + 0x41 + (uint)uVar5) * fVar21 +
               (float)(int)(iVar9 + 0x40 + (uint)uVar5) * fVar21) * 0.5;
      *(ulong *)(&atlas->TexUvLines[0].y + local_60) =
           CONCAT44(fVar2 * (float)(iVar9 + uVar14 + uVar4 + 0x41),fVar21);
      (&atlas->TexUvLines[0].w)[local_60] = fVar21;
      uVar13 = (ulong)((int)local_38 - 1);
      iVar18 = iVar18 + 1;
      local_60 = local_60 + 4;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0);
  }
  iVar18 = (atlas->CustomRects).Size;
  if (0 < iVar18) {
    lVar20 = 0;
    lVar19 = 0;
    do {
      pIVar10 = (atlas->CustomRects).Data;
      lVar8 = *(long *)((long)&pIVar10->Font + lVar20);
      if ((lVar8 != 0) && (*(int *)((long)&pIVar10->GlyphID + lVar20) != 0)) {
        if (*(ImFontAtlas **)(lVar8 + 0x40) != atlas) {
          __assert_fail("r->Font->ContainerAtlas == atlas",
                        "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                        ,0xaea,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
        }
        local_50.x = 0.0;
        local_50.y = 0.0;
        local_58.x = 0.0;
        local_58.y = 0.0;
        ImFontAtlas::CalcCustomRectUV
                  (atlas,(ImFontAtlasCustomRect *)((long)&pIVar10->Width + lVar20),&local_50,
                   &local_58);
        fVar2 = *(float *)((long)&(pIVar10->GlyphOffset).x + lVar20);
        fVar21 = *(float *)((long)&(pIVar10->GlyphOffset).y + lVar20);
        ImFont::AddGlyph(*(ImFont **)((long)&pIVar10->Font + lVar20),(ImFontConfig_conflict *)0x0,
                         *(ImWchar *)((long)&pIVar10->GlyphID + lVar20),fVar2,fVar21,
                         (float)*(ushort *)((long)&pIVar10->Width + lVar20) + fVar2,
                         (float)*(ushort *)((long)&pIVar10->Height + lVar20) + fVar21,local_50.x,
                         local_50.y,local_58.x,local_58.y,
                         *(float *)((long)&pIVar10->GlyphAdvanceX + lVar20));
        iVar18 = (atlas->CustomRects).Size;
      }
      lVar19 = lVar19 + 1;
      lVar20 = lVar20 + 0x20;
    } while (lVar19 < iVar18);
  }
  iVar18 = (atlas->Fonts).Size;
  if (0 < iVar18) {
    lVar20 = 0;
    do {
      this = (atlas->Fonts).Data[lVar20];
      if (this->DirtyLookupTables == true) {
        ImFont::BuildLookupTable(this);
        iVar18 = (atlas->Fonts).Size;
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < iVar18);
  }
  atlas->TexReady = true;
  return;
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL || atlas->TexPixelsRGBA32 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    atlas->TexReady = true;
}